

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&> *
__thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<testing::internal::PairMatcher<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_>,_1UL>
  local_29;
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&> *)
       0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&> *)
       0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ::reserve(&local_28,1);
  TransformTupleValuesHelper<std::tuple<testing::internal::PairMatcher<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_>,_testing::internal::CastAndAppendTransform<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>_>
  ::
  IterateOverTuple<std::tuple<testing::internal::PairMatcher<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_>,_1UL>
  ::operator()(&local_29,this,&local_28);
  this_00 = (ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>*,std::vector<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_long_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
                      )local_28.
                       super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018a6978;
  (__return_storage_ptr__->
  super_MatcherBase<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ).buffer_.ptr = (void *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ).vtable_ = (VTable *)
              MatcherBase<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
              ::
              GetVTable<testing::internal::MatcherBase<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>::ValuePolicy<testing::MatcherInterface<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>const*,true>>()
              ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<google::protobuf::Map<unsigned_long,proto2_unittest::Proto2MapEnumPlusExtra>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_google::protobuf::Map<unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018a6908;
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }